

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextInput.cpp
# Opt level: O2

bool __thiscall cursespp::TextInput::Write(TextInput *this,string *key)

{
  string *str;
  int iVar1;
  size_t sVar2;
  string *psVar3;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var4;
  string *psVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  sVar2 = f8n::utf::u8len(key);
  iVar1 = (int)sVar2;
  if (iVar1 == 1) {
    if (this->inputMode != InputRaw) {
      if (this->truncate == true) {
        sVar2 = f8n::utf::u8cols(&this->buffer);
        iVar1 = (*(this->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[0x16])(this);
        if (iVar1 <= (int)sVar2) {
          return false;
        }
      }
      str = &this->buffer;
      psVar3 = (string *)f8n::utf::u8offset(str,this->position);
      psVar5 = (string *)0x0;
      if (psVar3 != (string *)0xffffffffffffffff) {
        psVar5 = psVar3;
      }
      std::__cxx11::string::insert((ulong)str,psVar5);
      sVar2 = f8n::utf::u8len(str);
      this->bufferLength = sVar2;
      this->position = this->position + 1;
      goto LAB_00196728;
    }
  }
  else {
    if (iVar1 < 2) {
      return false;
    }
    if (this->inputMode != InputRaw) {
      return false;
    }
  }
  _Var4 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                    ((this->rawBlacklist).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->rawBlacklist).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,key);
  if (_Var4._M_current !=
      (this->rawBlacklist).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    return false;
  }
  std::__cxx11::string::_M_assign((string *)&this->buffer);
  this->bufferLength = (long)iVar1;
  this->position = iVar1;
LAB_00196728:
  std::__cxx11::string::string((string *)&local_40,(string *)&this->buffer);
  sigslot::
  signal2<cursespp::TextInput_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sigslot::multi_threaded_local>
  ::operator()(&this->TextChanged,this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  (*(this->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[5])(this);
  return true;
}

Assistant:

bool TextInput::Write(const std::string& key) {
    /* one character at a time. if it's more than one character, we're
    dealing with an escape sequence and should not print it unless
    the input mode allows for modifiers */
    int len = u8len(key);
    if (len == 1 || (len > 1 && this->inputMode == InputRaw)) {
        if (this->inputMode == InputRaw) {
            auto& bl = this->rawBlacklist;
            if (std::find(bl.begin(), bl.end(), key) != bl.end()) {
                return false;
            }
            this->buffer = key;
            this->bufferLength = len;
            this->position = len;
        }
        else {
            if (truncate) {
                int cols = u8cols(this->buffer);
                if (cols >= this->GetWidth()) {
                    return false;
                }
            }

            size_t offset = u8offset(this->buffer, this->position);
            offset = (offset == std::string::npos) ? 0 : offset;
            this->buffer.insert(offset, key);
            this->bufferLength = u8len(buffer);
            this->position += len;
        }

        this->TextChanged(this, this->buffer);
        this->Redraw();
        return true;
    }

    return false;
}